

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_iterator.h
# Opt level: O2

ScriptElement * __thiscall
cfd::core::IteratorWrapper<cfd::core::ScriptElement>::next
          (ScriptElement *__return_storage_ptr__,IteratorWrapper<cfd::core::ScriptElement> *this)

{
  bool bVar1;
  CfdException *this_00;
  ScriptElement *element;
  CfdSourceLocation local_28;
  
  bVar1 = this->reverse_;
  if ((&this->iterator_)[bVar1]._M_current !=
      (&(this->vector_).
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start)[bVar1 ^ 1]) {
    if (bVar1 == false) {
      element = (this->iterator_)._M_current;
      (this->iterator_)._M_current = element + 1;
    }
    else {
      element = (this->reverse_iterator_).current._M_current + -1;
      (this->reverse_iterator_).current._M_current = element;
    }
    ScriptElement::ScriptElement(__return_storage_ptr__,element);
    return __return_storage_ptr__;
  }
  local_28.filename = "cfdcore_iterator.h";
  local_28.line = 0x51;
  local_28.funcname = "next";
  logger::warn<std::__cxx11::string&>
            (&local_28,"Iterator reference out of range. error_message={}.",&this->error_message_);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  CfdException::CfdException(this_00,kCfdOutOfRangeError,&this->error_message_);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

T next() {
    if (!hasNext()) {
      cfd::core::logger::warn(
          CFD_LOG_SOURCE,
          "Iterator reference out of range."
          " error_message={}.",
          error_message_);
      throw CfdException(kCfdOutOfRangeError, error_message_);
    }
    if (reverse_) {
      return *(reverse_iterator_++);
    }
    return *(iterator_++);
  }